

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_abs_sub_bit(__mpz_struct *d,mp_bitcnt_t bit_index)

{
  mp_ptr rp;
  uint uVar1;
  mp_srcptr xp;
  uint uVar2;
  mp_limb_t mVar3;
  mp_size_t mVar4;
  int iVar5;
  ulong uVar6;
  ulong n;
  
  uVar1 = d->_mp_size;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  n = (ulong)uVar2;
  uVar6 = bit_index >> 6;
  if (uVar6 <= n && n - uVar6 != 0) {
    xp = d->_mp_d;
    rp = xp + uVar6;
    mVar3 = mpn_sub_1(rp,rp,n - uVar6,1L << ((byte)bit_index & 0x3f));
    if (mVar3 == 0) {
      mVar4 = mpn_normalized_size(xp,n);
      iVar5 = -(int)mVar4;
      if (-1 < d->_mp_size) {
        iVar5 = (int)mVar4;
      }
      d->_mp_size = iVar5;
      return;
    }
    __assert_fail("__cy == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0xe01,"void mpz_abs_sub_bit(__mpz_struct *, mp_bitcnt_t)");
  }
  __assert_fail("limb_index < dn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0xdfe,"void mpz_abs_sub_bit(__mpz_struct *, mp_bitcnt_t)");
}

Assistant:

static void
mpz_abs_sub_bit (mpz_t d, mp_bitcnt_t bit_index)
{
  mp_size_t dn, limb_index;
  mp_ptr dp;
  mp_limb_t bit;

  dn = GMP_ABS (d->_mp_size);
  dp = d->_mp_d;

  limb_index = bit_index / GMP_LIMB_BITS;
  bit = (mp_limb_t) 1 << (bit_index % GMP_LIMB_BITS);

  assert (limb_index < dn);

  gmp_assert_nocarry (mpn_sub_1 (dp + limb_index, dp + limb_index,
				 dn - limb_index, bit));
  dn = mpn_normalized_size (dp, dn);
  d->_mp_size = (d->_mp_size < 0) ? - dn : dn;
}